

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

int __thiscall QFSFileEngine::rmdir(QFSFileEngine *this,char *__path)

{
  bool bVar1;
  long in_FS_OFFSET;
  QFileSystemEntry *in_stack_ffffffffffffff98;
  QFileSystemEntry *this_00;
  QFileSystemEntry local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_40;
  QFileSystemEntry::QFileSystemEntry(this_00,&in_stack_ffffffffffffff98->m_filePath);
  bVar1 = QFileSystemEngine::removeDirectory(in_stack_ffffffffffffff98,false);
  QFileSystemEntry::~QFileSystemEntry(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),bVar1);
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::rmdir(const QString &name, bool recurseParentDirectories) const
{
    return QFileSystemEngine::removeDirectory(QFileSystemEntry(name), recurseParentDirectories);
}